

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRUP.cpp
# Opt level: O2

uint8_t SRUP_MSG::getByteVal(uint64_t ull,uint8_t p)

{
  uint8_t uVar1;
  
  uVar1 = '\0';
  if (p < 8) {
    uVar1 = (uint8_t)(ull >> (p * '\b' & 0x3f));
  }
  return uVar1;
}

Assistant:

uint8_t SRUP_MSG::getByteVal(uint64_t ull, uint8_t p)
{
    // Given that we have a 64-bit value – we only have 8 bits to play with...
    if ((p<0) || (p>7))
        return 0;

    uint8_t byte_val;
    byte_val = ull >> (uint8_t) (8 * p);
    return byte_val;
}